

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall LexerTest_LexInt_Test::TestBody(LexerTest_LexInt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  optional<unsigned_long> oVar3;
  string local_2f50;
  AssertHelper local_2f30;
  Message local_2f28 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f18;
  string_view local_2ef0;
  Lexer local_2ee0;
  _Storage<unsigned_long,_true> local_2e88;
  undefined1 local_2e80;
  bool local_2e71;
  undefined1 local_2e70 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_2e40;
  Message local_2e38 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e28;
  string_view local_2e00;
  Lexer local_2df0;
  _Storage<unsigned_long,_true> local_2d98;
  undefined1 local_2d90;
  bool local_2d81;
  undefined1 local_2d80 [8];
  AssertionResult gtest_ar__23;
  Message local_2d68;
  unsigned_long local_2d60 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d50;
  string_view local_2d28;
  Lexer local_2d18;
  _Storage<unsigned_long,_true> local_2cc0;
  undefined1 local_2cb8;
  undefined1 local_2cb0 [8];
  AssertionResult gtest_ar_31;
  AssertHelper local_2c80;
  Message local_2c78 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c68;
  string_view local_2c40;
  Lexer local_2c30;
  _Storage<unsigned_long,_true> local_2bd8;
  undefined1 local_2bd0;
  bool local_2bc1;
  undefined1 local_2bc0 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_2b90;
  Message local_2b88 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b78;
  string_view local_2b50;
  Lexer local_2b40;
  _Storage<unsigned_long,_true> local_2ae8;
  undefined1 local_2ae0;
  bool local_2ad1;
  undefined1 local_2ad0 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_2aa0;
  Message local_2a98 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a88;
  string_view local_2a60;
  Lexer local_2a50;
  _Storage<unsigned_long,_true> local_29f8;
  undefined1 local_29f0;
  bool local_29e1;
  undefined1 local_29e0 [8];
  AssertionResult gtest_ar__20;
  Message local_29c8;
  unsigned_long local_29c0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_29b0;
  string_view local_2988;
  Lexer local_2978;
  _Storage<unsigned_long,_true> local_2920;
  undefined1 local_2918;
  undefined1 local_2910 [8];
  AssertionResult gtest_ar_30;
  Message local_28f8;
  unsigned_long local_28f0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28e0;
  string_view local_28b8;
  Lexer local_28a8;
  _Storage<unsigned_long,_true> local_2850;
  undefined1 local_2848;
  undefined1 local_2840 [8];
  AssertionResult gtest_ar_29;
  Message local_2828;
  long local_2820 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2810;
  string_view local_27e8;
  Lexer local_27d8;
  _Storage<unsigned_long,_true> local_2780;
  undefined1 local_2778;
  undefined1 local_2770 [8];
  AssertionResult gtest_ar_28;
  AssertHelper local_2740;
  Message local_2738 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2728;
  string_view local_2700;
  Lexer local_26f0;
  _Storage<unsigned_long,_true> local_2698;
  undefined1 local_2690;
  bool local_2681;
  undefined1 local_2680 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_2650;
  Message local_2648 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2638;
  string_view local_2610;
  Lexer local_2600;
  _Storage<unsigned_long,_true> local_25a8;
  undefined1 local_25a0;
  bool local_2591;
  undefined1 local_2590 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_2560;
  Message local_2558 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2548;
  string_view local_2520;
  Lexer local_2510;
  _Storage<unsigned_long,_true> local_24b8;
  undefined1 local_24b0;
  bool local_24a1;
  undefined1 local_24a0 [8];
  AssertionResult gtest_ar__17;
  Message local_2488;
  unsigned_long local_2480 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2470;
  string_view local_2448;
  Lexer local_2438;
  _Storage<unsigned_long,_true> local_23e0;
  undefined1 local_23d8;
  undefined1 local_23d0 [8];
  AssertionResult gtest_ar_27;
  Message local_23b8;
  unsigned_long local_23b0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_23a0;
  string_view local_2378;
  Lexer local_2368;
  _Storage<unsigned_long,_true> local_2310;
  undefined1 local_2308;
  undefined1 local_2300 [8];
  AssertionResult gtest_ar_26;
  AssertHelper local_22d0;
  Message local_22c8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_22b8;
  string_view local_2290;
  Lexer local_2280;
  _Optional_payload_base<unsigned_int> local_2224;
  bool local_2219;
  undefined1 local_2218 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_21e8;
  Message local_21e0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_21d0;
  string_view local_21a8;
  Lexer local_2198;
  _Optional_payload_base<unsigned_int> local_213c;
  bool local_2131;
  undefined1 local_2130 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_2100;
  Message local_20f8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20e8;
  string_view local_20c0;
  Lexer local_20b0;
  _Optional_payload_base<unsigned_int> local_2054;
  bool local_2049;
  undefined1 local_2048 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_2018;
  Message local_2010 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2000;
  string_view local_1fd8;
  Lexer local_1fc8;
  _Optional_payload_base<unsigned_int> local_1f6c;
  bool local_1f61;
  undefined1 local_1f60 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_1f30;
  Message local_1f28 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f18;
  string_view local_1ef0;
  Lexer local_1ee0;
  _Optional_payload_base<unsigned_int> local_1e84;
  bool local_1e79;
  undefined1 local_1e78 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_1e48;
  Message local_1e40 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e30;
  string_view local_1e08;
  Lexer local_1df8;
  _Optional_payload_base<unsigned_int> local_1d9c;
  bool local_1d91;
  undefined1 local_1d90 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_1d60;
  Message local_1d58 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d48;
  string_view local_1d20;
  Lexer local_1d10;
  _Optional_payload_base<unsigned_int> local_1cb4;
  bool local_1ca9;
  undefined1 local_1ca8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_1c78;
  Message local_1c70 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c60;
  string_view local_1c38;
  Lexer local_1c28;
  _Optional_payload_base<unsigned_int> local_1bcc;
  bool local_1bc1;
  undefined1 local_1bc0 [8];
  AssertionResult gtest_ar__9;
  Message local_1ba8;
  uint local_1ba0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b98;
  string_view local_1b70;
  Lexer local_1b60;
  _Optional_payload_base<unsigned_int> local_1b08;
  undefined1 local_1b00 [8];
  AssertionResult gtest_ar_25;
  Message local_1ae8;
  uint local_1ae0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ad8;
  string_view local_1ab0;
  Lexer local_1aa0;
  _Optional_payload_base<unsigned_int> local_1a48;
  undefined1 local_1a40 [8];
  AssertionResult gtest_ar_24;
  Message local_1a28;
  uint local_1a20 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a18;
  string_view local_19f0;
  Lexer local_19e0;
  _Optional_payload_base<unsigned_int> local_1988;
  undefined1 local_1980 [8];
  AssertionResult gtest_ar_23;
  Message local_1968;
  uint local_1960 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1958;
  string_view local_1930;
  Lexer local_1920;
  _Optional_payload_base<unsigned_int> local_18c8;
  undefined1 local_18c0 [8];
  AssertionResult gtest_ar_22;
  Message local_18a8;
  uint local_18a0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1898;
  string_view local_1870;
  Lexer local_1860;
  _Optional_payload_base<unsigned_int> local_1808;
  undefined1 local_1800 [8];
  AssertionResult gtest_ar_21;
  AssertHelper local_17d0;
  Message local_17c8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17b8;
  string_view local_1790;
  Lexer local_1780;
  _Optional_payload_base<unsigned_int> local_1724;
  bool local_1719;
  undefined1 local_1718 [8];
  AssertionResult gtest_ar__8;
  Message local_1700;
  uint local_16f8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_16f0;
  string_view local_16c8;
  Lexer local_16b8;
  _Optional_payload_base<unsigned_int> local_1660;
  undefined1 local_1658 [8];
  AssertionResult gtest_ar_20;
  AssertHelper local_1628;
  Message local_1620 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1610;
  string_view local_15e8;
  Lexer local_15d8;
  _Optional_payload_base<unsigned_int> local_157c;
  bool local_1571;
  undefined1 local_1570 [8];
  AssertionResult gtest_ar__7;
  Message local_1558;
  uint local_1550 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1548;
  string_view local_1520;
  Lexer local_1510;
  _Optional_payload_base<unsigned_int> local_14b8;
  undefined1 local_14b0 [8];
  AssertionResult gtest_ar_19;
  Message local_1498;
  uint local_1490 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1488;
  string_view local_1460;
  Lexer local_1450;
  _Optional_payload_base<unsigned_int> local_13f8;
  undefined1 local_13f0 [8];
  AssertionResult gtest_ar_18;
  Message local_13d8;
  unsigned_short local_13cc [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13c8;
  string_view local_13a0;
  Lexer local_1390;
  _Optional_payload_base<unsigned_short> local_1334;
  undefined1 local_1330 [8];
  AssertionResult gtest_ar_17;
  AssertHelper local_1300;
  Message local_12f8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12e8;
  string_view local_12c0;
  Lexer local_12b0;
  _Optional_payload_base<unsigned_char> local_1253;
  bool local_1251;
  undefined1 local_1250 [8];
  AssertionResult gtest_ar__6;
  Message local_1238;
  uchar local_122a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1228;
  string_view local_1200;
  Lexer local_11f0;
  _Optional_payload_base<unsigned_char> local_1192;
  undefined1 local_1190 [8];
  AssertionResult gtest_ar_16;
  AssertHelper local_1160;
  Message local_1158 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1148;
  string_view local_1120;
  Lexer local_1110;
  _Optional_payload_base<unsigned_char> local_10b3;
  bool local_10b1;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar__5;
  Message local_1098;
  uchar local_108a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1088;
  string_view local_1060;
  Lexer local_1050;
  _Optional_payload_base<unsigned_char> local_ff2;
  undefined1 local_ff0 [8];
  AssertionResult gtest_ar_15;
  AssertHelper local_fc0;
  Message local_fb8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fa8;
  string_view local_f80;
  Lexer local_f70;
  _Optional_payload_base<unsigned_char> local_f13;
  bool local_f11;
  undefined1 local_f10 [8];
  AssertionResult gtest_ar__4;
  Message local_ef8;
  uchar local_eea [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ee8;
  string_view local_ec0;
  Lexer local_eb0;
  _Optional_payload_base<unsigned_char> local_e52;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar_14;
  Message local_e38;
  uchar local_e2a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e28;
  string_view local_e00;
  Lexer local_df0;
  _Optional_payload_base<unsigned_char> local_d92;
  undefined1 local_d90 [8];
  AssertionResult gtest_ar_13;
  Message local_d78;
  uchar local_d6a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d68;
  string_view local_d40;
  Lexer local_d30;
  _Optional_payload_base<unsigned_char> local_cd2;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_ca0;
  Message local_c98 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c88;
  string_view local_c60;
  Lexer local_c50;
  _Optional_payload_base<unsigned_char> local_bf3;
  bool local_bf1;
  undefined1 local_bf0 [8];
  AssertionResult gtest_ar__3;
  Message local_bd8;
  uchar local_bca [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bc8;
  string_view local_ba0;
  Lexer local_b90;
  _Optional_payload_base<unsigned_char> local_b32;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_b00;
  Message local_af8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ae8;
  string_view local_ac0;
  Lexer local_ab0;
  _Optional_payload_base<unsigned_char> local_a53;
  bool local_a51;
  undefined1 local_a50 [8];
  AssertionResult gtest_ar__2;
  Message local_a38;
  uchar local_a2a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a28;
  string_view local_a00;
  Lexer local_9f0;
  _Optional_payload_base<unsigned_char> local_992;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_10;
  Message local_978;
  uchar local_96a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_968;
  string_view local_940;
  Lexer local_930;
  _Optional_payload_base<unsigned_char> local_8d2;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_9;
  Message local_8b8;
  uchar local_8aa [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8a8;
  string_view local_880;
  Lexer local_870;
  _Optional_payload_base<unsigned_char> local_812;
  undefined1 local_810 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_7e0;
  Message local_7d8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7c8;
  string_view local_7a0;
  Lexer local_790;
  _Optional_payload_base<unsigned_char> local_733;
  bool local_731;
  undefined1 local_730 [8];
  AssertionResult gtest_ar__1;
  Message local_718;
  uchar local_70a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_708;
  string_view local_6e0;
  Lexer local_6d0;
  _Optional_payload_base<unsigned_char> local_672;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_640;
  Message local_638 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_628;
  string_view local_600;
  Lexer local_5f0;
  _Optional_payload_base<unsigned_char> local_593;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar_;
  Message local_578;
  unsigned_long local_570 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_560;
  string_view local_538;
  Lexer local_528;
  _Storage<unsigned_long,_true> local_4d0;
  undefined1 local_4c8;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_6;
  Message local_4a8;
  unsigned_long local_4a0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  string_view local_468;
  Lexer local_458;
  _Storage<unsigned_long,_true> local_400;
  undefined1 local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_5;
  Message local_3d8;
  uint local_3d0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c8;
  string_view local_3a0;
  Lexer local_390;
  _Optional_payload_base<unsigned_int> local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_4;
  Message local_318;
  uint local_310 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  string_view local_2e0;
  Lexer local_2d0;
  _Optional_payload_base<unsigned_int> local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  Message local_258;
  unsigned_short local_24c [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  string_view local_220;
  Lexer local_210;
  _Optional_payload_base<unsigned_short> local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_2;
  Message local_198;
  uchar local_18a [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  string_view local_160;
  Lexer local_150;
  _Optional_payload_base<unsigned_char> local_f2;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  Message local_d8;
  uchar local_cd [21];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  string_view local_90;
  Lexer local_80;
  _Optional_payload_base<unsigned_char> local_22;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  LexerTest_LexInt_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_90 = sv("0",1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_80,local_90,&local_b8);
  local_22 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_80);
  local_cd[0] = '\0';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_20,"Lexer(\"0\"sv).takeU8()","uint8_t(0)",
             (optional<unsigned_char> *)&local_22,local_cd);
  ::wasm::WATParser::Lexer::~Lexer(&local_80);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_160 = sv("0",1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_150,local_160,&local_188);
  local_f2 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_150);
  local_18a[0] = '\0';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_f0,"Lexer(\"0\"sv).takeI8()","uint8_t(0)",
             (optional<unsigned_char> *)&local_f2,local_18a);
  ::wasm::WATParser::Lexer::~Lexer(&local_150);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_220 = sv("0",1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_210,local_220,&local_248);
  local_1b4 = (_Optional_payload_base<unsigned_short>)::wasm::WATParser::Lexer::takeI16(&local_210);
  local_24c[0] = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_short>,_unsigned_short,_nullptr>
            ((EqHelper *)local_1b0,"Lexer(\"0\"sv).takeI16()","uint16_t(0)",
             (optional<unsigned_short> *)&local_1b4,local_24c);
  ::wasm::WATParser::Lexer::~Lexer(&local_210);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_2e0 = sv("0",1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2d0,local_2e0,&local_308);
  local_278 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_2d0);
  local_310[0] = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_270,"Lexer(\"0\"sv).takeU32()","uint32_t(0)",
             (optional<unsigned_int> *)&local_278,local_310);
  ::wasm::WATParser::Lexer::~Lexer(&local_2d0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_3a0 = sv("0",1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_390,local_3a0,&local_3c8);
  local_338 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_390);
  local_3d0[0] = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_330,"Lexer(\"0\"sv).takeI32()","uint32_t(0)",
             (optional<unsigned_int> *)&local_338,local_3d0);
  ::wasm::WATParser::Lexer::~Lexer(&local_390);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_3c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_468 = sv("0",1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_458,local_468,&local_490);
  oVar3 = ::wasm::WATParser::Lexer::takeU64(&local_458);
  local_400._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_3f8 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged;
  local_4a0[0] = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_unsigned_long,_nullptr>
            ((EqHelper *)local_3f0,"Lexer(\"0\"sv).takeU64()","uint64_t(0)",
             (optional<unsigned_long> *)&local_400,local_4a0);
  ::wasm::WATParser::Lexer::~Lexer(&local_458);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_538 = sv("0",1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_528,local_538,&local_560);
  oVar3 = ::wasm::WATParser::Lexer::takeI64(&local_528);
  local_4d0._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_4c8 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged;
  local_570[0] = 0;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_unsigned_long,_nullptr>
            ((EqHelper *)local_4c0,"Lexer(\"0\"sv).takeI64()","uint64_t(0)",
             (optional<unsigned_long> *)&local_4d0,local_570);
  ::wasm::WATParser::Lexer::~Lexer(&local_528);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_560);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_600 = sv("+0",2);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_5f0,local_600,&local_628);
  local_593 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_5f0);
  local_591 = std::optional::operator_cast_to_bool((optional *)&local_593);
  local_591 = !local_591;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_590,&local_591,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_5f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_628);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(local_638);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_590,
               (AssertionResult *)"Lexer(\"+0\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_640,local_638);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  local_6e0 = sv("+0",2);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_6d0,local_6e0,&local_708);
  local_672 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_6d0);
  local_70a[0] = '\0';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_670,"Lexer(\"+0\"sv).takeI8()","uint8_t(0)",
             (optional<unsigned_char> *)&local_672,local_70a);
  ::wasm::WATParser::Lexer::~Lexer(&local_6d0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_708);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_7a0 = sv("-0",2);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_790,local_7a0,&local_7c8);
  local_733 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_790);
  local_731 = std::optional::operator_cast_to_bool((optional *)&local_733);
  local_731 = !local_731;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_730,&local_731,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_790);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_7c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(local_7d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_8.message_,(internal *)local_730,
               (AssertionResult *)"Lexer(\"-0\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e0,local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  local_880 = sv("-0",2);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_870,local_880,&local_8a8);
  local_812 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_870);
  local_8aa[0] = '\0';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_810,"Lexer(\"-0\"sv).takeI8()","uint8_t(0)",
             (optional<unsigned_char> *)&local_812,local_8aa);
  ::wasm::WATParser::Lexer::~Lexer(&local_870);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_8a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    testing::Message::Message(&local_8b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_810);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  local_940 = sv("1",1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_930,local_940,&local_968);
  local_8d2 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_930);
  local_96a[0] = '\x01';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_8d0,"Lexer(\"1\"sv).takeU8()","uint8_t(1)",
             (optional<unsigned_char> *)&local_8d2,local_96a);
  ::wasm::WATParser::Lexer::~Lexer(&local_930);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_968);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  local_a00 = sv("1",1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_9f0,local_a00,&local_a28);
  local_992 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_9f0);
  local_a2a[0] = '\x01';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_990,"Lexer(\"1\"sv).takeI8()","uint8_t(1)",
             (optional<unsigned_char> *)&local_992,local_a2a);
  ::wasm::WATParser::Lexer::~Lexer(&local_9f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_a28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar1) {
    testing::Message::Message(&local_a38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_a38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_a38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  local_ac0 = sv("+1",2);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_ab0,local_ac0,&local_ae8);
  local_a53 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_ab0);
  local_a51 = std::optional::operator_cast_to_bool((optional *)&local_a53);
  local_a51 = !local_a51;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a50,&local_a51,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_ab0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_ae8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a50);
  if (!bVar1) {
    testing::Message::Message(local_af8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_11.message_,(internal *)local_a50,
               (AssertionResult *)"Lexer(\"+1\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b00,local_af8);
    testing::internal::AssertHelper::~AssertHelper(&local_b00);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(local_af8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a50);
  local_ba0 = sv("+1",2);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_b90,local_ba0,&local_bc8);
  local_b32 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_b90);
  local_bca[0] = '\x01';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_b30,"Lexer(\"+1\"sv).takeI8()","uint8_t(1)",
             (optional<unsigned_char> *)&local_b32,local_bca);
  ::wasm::WATParser::Lexer::~Lexer(&local_b90);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_bc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
  if (!bVar1) {
    testing::Message::Message(&local_bd8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_bd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_bd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
  local_c60 = sv("-1",2);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_c50,local_c60,&local_c88);
  local_bf3 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_c50);
  local_bf1 = std::optional::operator_cast_to_bool((optional *)&local_bf3);
  local_bf1 = !local_bf1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bf0,&local_bf1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_c50);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_c88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf0);
  if (!bVar1) {
    testing::Message::Message(local_c98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_12.message_,(internal *)local_bf0,
               (AssertionResult *)"Lexer(\"-1\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ca0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ca0,local_c98);
    testing::internal::AssertHelper::~AssertHelper(&local_ca0);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d40,"-1");
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_d30,local_d40,&local_d68);
  local_cd2 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_d30);
  local_d6a[0] = 0xff;
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_cd0,"Lexer(\"-1\").takeI8()","uint8_t(-1)",
             (optional<unsigned_char> *)&local_cd2,local_d6a);
  ::wasm::WATParser::Lexer::~Lexer(&local_d30);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_d68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd0);
  if (!bVar1) {
    testing::Message::Message(&local_d78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_d78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_d78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
  local_e00 = sv("0010",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_df0,local_e00,&local_e28);
  local_d92 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_df0);
  local_e2a[0] = '\n';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_d90,"Lexer(\"0010\"sv).takeU8()","uint8_t(10)",
             (optional<unsigned_char> *)&local_d92,local_e2a);
  ::wasm::WATParser::Lexer::~Lexer(&local_df0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_e28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d90);
  if (!bVar1) {
    testing::Message::Message(&local_e38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_e38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_e38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d90);
  local_ec0 = sv("0010",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_eb0,local_ec0,&local_ee8);
  local_e52 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_eb0);
  local_eea[0] = '\n';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_e50,"Lexer(\"0010\"sv).takeI8()","uint8_t(10)",
             (optional<unsigned_char> *)&local_e52,local_eea);
  ::wasm::WATParser::Lexer::~Lexer(&local_eb0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_ee8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e50);
  if (!bVar1) {
    testing::Message::Message(&local_ef8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_ef8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_ef8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
  local_f80 = sv("+0010",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_f70,local_f80,&local_fa8);
  local_f13 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_f70);
  local_f11 = std::optional::operator_cast_to_bool((optional *)&local_f13);
  local_f11 = !local_f11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f10,&local_f11,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_f70);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_fa8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f10);
  if (!bVar1) {
    testing::Message::Message(local_fb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_15.message_,(internal *)local_f10,
               (AssertionResult *)"Lexer(\"+0010\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_fc0,local_fb8);
    testing::internal::AssertHelper::~AssertHelper(&local_fc0);
    std::__cxx11::string::~string((string *)&gtest_ar_15.message_);
    testing::Message::~Message(local_fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f10);
  local_1060 = sv("+0010",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1050,local_1060,&local_1088);
  local_ff2 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_1050);
  local_108a[0] = '\n';
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_ff0,"Lexer(\"+0010\"sv).takeI8()","uint8_t(10)",
             (optional<unsigned_char> *)&local_ff2,local_108a);
  ::wasm::WATParser::Lexer::~Lexer(&local_1050);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1088);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ff0);
  if (!bVar1) {
    testing::Message::Message(&local_1098);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ff0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_1098);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1098);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ff0);
  local_1120 = sv("-0010",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1110,local_1120,&local_1148);
  local_10b3 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_1110);
  local_10b1 = std::optional::operator_cast_to_bool((optional *)&local_10b3);
  local_10b1 = !local_10b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10b0,&local_10b1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1110);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b0);
  if (!bVar1) {
    testing::Message::Message(local_1158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_16.message_,(internal *)local_10b0,
               (AssertionResult *)"Lexer(\"-0010\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1160,local_1158);
    testing::internal::AssertHelper::~AssertHelper(&local_1160);
    std::__cxx11::string::~string((string *)&gtest_ar_16.message_);
    testing::Message::~Message(local_1158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b0);
  local_1200 = sv("-0010",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_11f0,local_1200,&local_1228);
  local_1192 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeI8(&local_11f0);
  local_122a[0] = 0xf6;
  testing::internal::EqHelper::Compare<std::optional<unsigned_char>,_unsigned_char,_nullptr>
            ((EqHelper *)local_1190,"Lexer(\"-0010\"sv).takeI8()","uint8_t(-10)",
             (optional<unsigned_char> *)&local_1192,local_122a);
  ::wasm::WATParser::Lexer::~Lexer(&local_11f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1190);
  if (!bVar1) {
    testing::Message::Message(&local_1238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6.message_,&local_1238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_1238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1190);
  local_12c0 = sv("9999",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_12b0,local_12c0,&local_12e8);
  local_1253 = (_Optional_payload_base<unsigned_char>)::wasm::WATParser::Lexer::takeU8(&local_12b0);
  local_1251 = std::optional::operator_cast_to_bool((optional *)&local_1253);
  local_1251 = !local_1251;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1250,&local_1251,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_12b0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_12e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1250);
  if (!bVar1) {
    testing::Message::Message(local_12f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_17.message_,(internal *)local_1250,
               (AssertionResult *)"Lexer(\"9999\"sv).takeU8()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1300,local_12f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1300);
    std::__cxx11::string::~string((string *)&gtest_ar_17.message_);
    testing::Message::~Message(local_12f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1250);
  local_13a0 = sv("9999",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1390,local_13a0,&local_13c8);
  local_1334 = (_Optional_payload_base<unsigned_short>)
               ::wasm::WATParser::Lexer::takeI16(&local_1390);
  local_13cc[0] = 9999;
  testing::internal::EqHelper::Compare<std::optional<unsigned_short>,_unsigned_short,_nullptr>
            ((EqHelper *)local_1330,"Lexer(\"9999\"sv).takeI16()","uint16_t(9999)",
             (optional<unsigned_short> *)&local_1334,local_13cc);
  ::wasm::WATParser::Lexer::~Lexer(&local_1390);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_13c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1330);
  if (!bVar1) {
    testing::Message::Message(&local_13d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_13d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_13d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1330);
  local_1460 = sv("9999",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1450,local_1460,&local_1488);
  local_13f8 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1450);
  local_1490[0] = 9999;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_13f0,"Lexer(\"9999\"sv).takeU32()","uint32_t(9999)",
             (optional<unsigned_int> *)&local_13f8,local_1490);
  ::wasm::WATParser::Lexer::~Lexer(&local_1450);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1488);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13f0);
  if (!bVar1) {
    testing::Message::Message(&local_1498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_1498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_1498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13f0);
  local_1520 = sv("9999",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1510,local_1520,&local_1548);
  local_14b8 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1510);
  local_1550[0] = 9999;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_14b0,"Lexer(\"9999\"sv).takeI32()","uint32_t(9999)",
             (optional<unsigned_int> *)&local_14b8,local_1550);
  ::wasm::WATParser::Lexer::~Lexer(&local_1510);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14b0);
  if (!bVar1) {
    testing::Message::Message(&local_1558);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_14b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_1558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_1558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14b0);
  local_15e8 = sv("+9999",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_15d8,local_15e8,&local_1610);
  local_157c = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_15d8);
  local_1571 = std::optional::operator_cast_to_bool((optional *)&local_157c);
  local_1571 = !local_1571;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1570,&local_1571,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_15d8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1610);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1570);
  if (!bVar1) {
    testing::Message::Message(local_1620);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_20.message_,(internal *)local_1570,
               (AssertionResult *)"Lexer(\"+9999\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1628,local_1620);
    testing::internal::AssertHelper::~AssertHelper(&local_1628);
    std::__cxx11::string::~string((string *)&gtest_ar_20.message_);
    testing::Message::~Message(local_1620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1570);
  local_16c8 = sv("+9999",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_16b8,local_16c8,&local_16f0);
  local_1660 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_16b8);
  local_16f8[0] = 9999;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1658,"Lexer(\"+9999\"sv).takeI32()","uint32_t(9999)",
             (optional<unsigned_int> *)&local_1660,local_16f8);
  ::wasm::WATParser::Lexer::~Lexer(&local_16b8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_16f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1658);
  if (!bVar1) {
    testing::Message::Message(&local_1700);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8.message_,&local_1700);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_1700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1658);
  local_1790 = sv("-9999",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1780,local_1790,&local_17b8);
  local_1724 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1780);
  local_1719 = std::optional::operator_cast_to_bool((optional *)&local_1724);
  local_1719 = !local_1719;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1718,&local_1719,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1780);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_17b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1718);
  if (!bVar1) {
    testing::Message::Message(local_17c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_21.message_,(internal *)local_1718,
               (AssertionResult *)"Lexer(\"-9999\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_17d0,local_17c8);
    testing::internal::AssertHelper::~AssertHelper(&local_17d0);
    std::__cxx11::string::~string((string *)&gtest_ar_21.message_);
    testing::Message::~Message(local_17c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1718);
  local_1870 = sv("-9999",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1860,local_1870,&local_1898);
  local_1808 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1860);
  local_18a0[0] = 0xffffd8f1;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1800,"Lexer(\"-9999\"sv).takeI32()","uint32_t(-9999)",
             (optional<unsigned_int> *)&local_1808,local_18a0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1860);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1898);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1800);
  if (!bVar1) {
    testing::Message::Message(&local_18a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_18a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_18a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1800);
  local_1930 = sv("12_34",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1920,local_1930,&local_1958);
  local_18c8 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1920);
  local_1960[0] = 0x4d2;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_18c0,"Lexer(\"12_34\"sv).takeU32()","uint32_t(1234)",
             (optional<unsigned_int> *)&local_18c8,local_1960);
  ::wasm::WATParser::Lexer::~Lexer(&local_1920);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1958);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18c0);
  if (!bVar1) {
    testing::Message::Message(&local_1968);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_18c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_1968);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_1968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18c0);
  local_19f0 = sv("12_34",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_19e0,local_19f0,&local_1a18);
  local_1988 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_19e0);
  local_1a20[0] = 0x4d2;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1980,"Lexer(\"12_34\"sv).takeI32()","uint32_t(1234)",
             (optional<unsigned_int> *)&local_1988,local_1a20);
  ::wasm::WATParser::Lexer::~Lexer(&local_19e0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1a18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1980);
  if (!bVar1) {
    testing::Message::Message(&local_1a28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1980);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_1a28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_1a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1980);
  local_1ab0 = sv("1_2_3_4",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1aa0,local_1ab0,&local_1ad8);
  local_1a48 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1aa0);
  local_1ae0[0] = 0x4d2;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1a40,"Lexer(\"1_2_3_4\"sv).takeU32()","uint32_t(1234)",
             (optional<unsigned_int> *)&local_1a48,local_1ae0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1aa0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1ad8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a40);
  if (!bVar1) {
    testing::Message::Message(&local_1ae8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_1ae8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_1ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a40);
  local_1b70 = sv("1_2_3_4",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1b60,local_1b70,&local_1b98);
  local_1b08 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1b60);
  local_1ba0[0] = 0x4d2;
  testing::internal::EqHelper::Compare<std::optional<unsigned_int>,_unsigned_int,_nullptr>
            ((EqHelper *)local_1b00,"Lexer(\"1_2_3_4\"sv).takeI32()","uint32_t(1234)",
             (optional<unsigned_int> *)&local_1b08,local_1ba0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1b60);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1b98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b00);
  if (!bVar1) {
    testing::Message::Message(&local_1ba8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__9.message_,&local_1ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_1ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b00);
  local_1c38 = sv("_1234",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1c28,local_1c38,&local_1c60);
  local_1bcc = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1c28);
  local_1bc1 = std::optional::operator_cast_to_bool((optional *)&local_1bcc);
  local_1bc1 = !local_1bc1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1bc0,&local_1bc1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1c28);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1c60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bc0);
  if (!bVar1) {
    testing::Message::Message(local_1c70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_1bc0,
               (AssertionResult *)"Lexer(\"_1234\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c78,local_1c70);
    testing::internal::AssertHelper::~AssertHelper(&local_1c78);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_1c70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bc0);
  local_1d20 = sv("_1234",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1d10,local_1d20,&local_1d48);
  local_1cb4 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1d10);
  local_1ca9 = std::optional::operator_cast_to_bool((optional *)&local_1cb4);
  local_1ca9 = !local_1ca9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1ca8,&local_1ca9,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1d10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1d48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ca8);
  if (!bVar1) {
    testing::Message::Message(local_1d58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_1ca8,
               (AssertionResult *)"Lexer(\"_1234\"sv).takeI32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d60,local_1d58);
    testing::internal::AssertHelper::~AssertHelper(&local_1d60);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(local_1d58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ca8);
  local_1e08 = sv("1234_",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1df8,local_1e08,&local_1e30);
  local_1d9c = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1df8);
  local_1d91 = std::optional::operator_cast_to_bool((optional *)&local_1d9c);
  local_1d91 = !local_1d91;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d90,&local_1d91,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1df8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1e30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d90);
  if (!bVar1) {
    testing::Message::Message(local_1e40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_1d90,
               (AssertionResult *)"Lexer(\"1234_\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e48,local_1e40);
    testing::internal::AssertHelper::~AssertHelper(&local_1e48);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(local_1e40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d90);
  local_1ef0 = sv("1234_",5);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1ee0,local_1ef0,&local_1f18);
  local_1e84 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_1ee0);
  local_1e79 = std::optional::operator_cast_to_bool((optional *)&local_1e84);
  local_1e79 = !local_1e79;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e78,&local_1e79,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1ee0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_1f18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e78);
  if (!bVar1) {
    testing::Message::Message(local_1f28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_1e78,
               (AssertionResult *)"Lexer(\"1234_\"sv).takeI32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f30,local_1f28);
    testing::internal::AssertHelper::~AssertHelper(&local_1f30);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(local_1f28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e78);
  local_1fd8 = sv("12__34",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_1fc8,local_1fd8,&local_2000);
  local_1f6c = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_1fc8);
  local_1f61 = std::optional::operator_cast_to_bool((optional *)&local_1f6c);
  local_1f61 = !local_1f61;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f60,&local_1f61,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_1fc8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2000);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f60);
  if (!bVar1) {
    testing::Message::Message(local_2010);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_1f60,
               (AssertionResult *)"Lexer(\"12__34\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2018,local_2010);
    testing::internal::AssertHelper::~AssertHelper(&local_2018);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(local_2010);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f60);
  local_20c0 = sv("12__34",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_20b0,local_20c0,&local_20e8);
  local_2054 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_20b0);
  local_2049 = std::optional::operator_cast_to_bool((optional *)&local_2054);
  local_2049 = !local_2049;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2048,&local_2049,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_20b0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_20e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2048);
  if (!bVar1) {
    testing::Message::Message(local_20f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_2048,
               (AssertionResult *)"Lexer(\"12__34\"sv).takeI32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2100,local_20f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2100);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(local_20f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2048);
  local_21a8 = sv("12cd56",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2198,local_21a8,&local_21d0);
  local_213c = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeU32(&local_2198);
  local_2131 = std::optional::operator_cast_to_bool((optional *)&local_213c);
  local_2131 = !local_2131;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2130,&local_2131,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2198);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_21d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2130);
  if (!bVar1) {
    testing::Message::Message(local_21e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_2130,
               (AssertionResult *)"Lexer(\"12cd56\"sv).takeU32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_21e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x9c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_21e8,local_21e0);
    testing::internal::AssertHelper::~AssertHelper(&local_21e8);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(local_21e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2130);
  local_2290 = sv("12cd56",6);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2280,local_2290,&local_22b8);
  local_2224 = (_Optional_payload_base<unsigned_int>)::wasm::WATParser::Lexer::takeI32(&local_2280);
  local_2219 = std::optional::operator_cast_to_bool((optional *)&local_2224);
  local_2219 = !local_2219;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2218,&local_2219,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2280);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_22b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2218);
  if (!bVar1) {
    testing::Message::Message(local_22c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_26.message_,(internal *)local_2218,
               (AssertionResult *)"Lexer(\"12cd56\"sv).takeI32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_22d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_22d0,local_22c8);
    testing::internal::AssertHelper::~AssertHelper(&local_22d0);
    std::__cxx11::string::~string((string *)&gtest_ar_26.message_);
    testing::Message::~Message(local_22c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2218);
  local_2378 = sv("18446744073709551615",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2368,local_2378,&local_23a0);
  oVar3 = ::wasm::WATParser::Lexer::takeU64(&local_2368);
  local_2310._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_2308 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_23b0[0] = 0xffffffffffffffff;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_unsigned_long,_nullptr>
            ((EqHelper *)local_2300,"Lexer(\"18446744073709551615\"sv).takeU64()","uint64_t(-1)",
             (optional<unsigned_long> *)&local_2310,local_23b0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2368);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_23a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2300);
  if (!bVar1) {
    testing::Message::Message(&local_23b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_23b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_23b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2300);
  local_2448 = sv("18446744073709551615",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2438,local_2448,&local_2470);
  oVar3 = ::wasm::WATParser::Lexer::takeI64(&local_2438);
  local_23e0._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_23d8 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_2480[0] = 0xffffffffffffffff;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_unsigned_long,_nullptr>
            ((EqHelper *)local_23d0,"Lexer(\"18446744073709551615\"sv).takeI64()","uint64_t(-1)",
             (optional<unsigned_long> *)&local_23e0,local_2480);
  ::wasm::WATParser::Lexer::~Lexer(&local_2438);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2470);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_23d0);
  if (!bVar1) {
    testing::Message::Message(&local_2488);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_23d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_2488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_2488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_23d0);
  local_2520 = sv("18446744073709551616",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2510,local_2520,&local_2548);
  oVar3 = ::wasm::WATParser::Lexer::takeU64(&local_2510);
  local_24b8._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_24b0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_24a1 = std::optional::operator_cast_to_bool((optional *)&local_24b8);
  local_24a1 = !local_24a1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_24a0,&local_24a1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2510);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_24a0);
  if (!bVar1) {
    testing::Message::Message(local_2558);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_24a0,
               (AssertionResult *)"Lexer(\"18446744073709551616\"sv).takeU64()","true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2560,local_2558);
    testing::internal::AssertHelper::~AssertHelper(&local_2560);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(local_2558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_24a0);
  local_2610 = sv("18446744073709551616",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2600,local_2610,&local_2638);
  oVar3 = ::wasm::WATParser::Lexer::takeI64(&local_2600);
  local_25a8._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_25a0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_2591 = std::optional::operator_cast_to_bool((optional *)&local_25a8);
  local_2591 = !local_2591;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2590,&local_2591,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2600);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2638);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2590);
  if (!bVar1) {
    testing::Message::Message(local_2648);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_2590,
               (AssertionResult *)"Lexer(\"18446744073709551616\"sv).takeI64()","true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2650,local_2648);
    testing::internal::AssertHelper::~AssertHelper(&local_2650);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(local_2648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2590);
  local_2700 = sv("+9223372036854775807",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_26f0,local_2700,&local_2728);
  oVar3 = ::wasm::WATParser::Lexer::takeU64(&local_26f0);
  local_2698._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_2690 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_2681 = std::optional::operator_cast_to_bool((optional *)&local_2698);
  local_2681 = !local_2681;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2680,&local_2681,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_26f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2728);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2680);
  if (!bVar1) {
    testing::Message::Message(local_2738);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_28.message_,(internal *)local_2680,
               (AssertionResult *)"Lexer(\"+9223372036854775807\"sv).takeU64()","true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2740,local_2738);
    testing::internal::AssertHelper::~AssertHelper(&local_2740);
    std::__cxx11::string::~string((string *)&gtest_ar_28.message_);
    testing::Message::~Message(local_2738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2680);
  local_27e8 = sv("+9223372036854775807",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_27d8,local_27e8,&local_2810);
  oVar3 = ::wasm::WATParser::Lexer::takeI64(&local_27d8);
  local_2780._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_2778 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_2820[0] = 0x7fffffffffffffff;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_long,_nullptr>
            ((EqHelper *)local_2770,"Lexer(\"+9223372036854775807\"sv).takeI64()",
             "(9223372036854775807L)",(optional<unsigned_long> *)&local_2780,local_2820);
  ::wasm::WATParser::Lexer::~Lexer(&local_27d8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2810);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2770);
  if (!bVar1) {
    testing::Message::Message(&local_2828);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_2828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_2828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2770);
  local_28b8 = sv("9223372036854775808",0x13);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_28a8,local_28b8,&local_28e0);
  oVar3 = ::wasm::WATParser::Lexer::takeU64(&local_28a8);
  local_2850._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_2848 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_28f0[0] = 0x8000000000000000;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_unsigned_long,_nullptr>
            ((EqHelper *)local_2840,"Lexer(\"9223372036854775808\"sv).takeU64()",
             "uint64_t((9223372036854775807L)) + 1",(optional<unsigned_long> *)&local_2850,
             local_28f0);
  ::wasm::WATParser::Lexer::~Lexer(&local_28a8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_28e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2840);
  if (!bVar1) {
    testing::Message::Message(&local_28f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_28f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_28f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2840);
  local_2988 = sv("9223372036854775808",0x13);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2978,local_2988,&local_29b0);
  oVar3 = ::wasm::WATParser::Lexer::takeI64(&local_2978);
  local_2920._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_2918 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_29c0[0] = 0x8000000000000000;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_unsigned_long,_nullptr>
            ((EqHelper *)local_2910,"Lexer(\"9223372036854775808\"sv).takeI64()",
             "uint64_t((9223372036854775807L)) + 1",(optional<unsigned_long> *)&local_2920,
             local_29c0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2978);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_29b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2910);
  if (!bVar1) {
    testing::Message::Message(&local_29c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__20.message_,&local_29c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_29c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2910);
  local_2a60 = sv("+9223372036854775808",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2a50,local_2a60,&local_2a88);
  oVar3 = ::wasm::WATParser::Lexer::takeU64(&local_2a50);
  local_29f8._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_29f0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_29e1 = std::optional::operator_cast_to_bool((optional *)&local_29f8);
  local_29e1 = !local_29e1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_29e0,&local_29e1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2a50);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2a88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_29e0);
  if (!bVar1) {
    testing::Message::Message(local_2a98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_29e0,
               (AssertionResult *)"Lexer(\"+9223372036854775808\"sv).takeU64()","true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2aa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2aa0,local_2a98);
    testing::internal::AssertHelper::~AssertHelper(&local_2aa0);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(local_2a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_29e0);
  local_2b50 = sv("+9223372036854775808",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2b40,local_2b50,&local_2b78);
  oVar3 = ::wasm::WATParser::Lexer::takeI64(&local_2b40);
  local_2ae8._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_2ae0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_2ad1 = std::optional::operator_cast_to_bool((optional *)&local_2ae8);
  local_2ad1 = !local_2ad1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2ad0,&local_2ad1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2b40);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2b78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ad0);
  if (!bVar1) {
    testing::Message::Message(local_2b88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_2ad0,
               (AssertionResult *)"Lexer(\"+9223372036854775808\"sv).takeI64()","true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b90,local_2b88);
    testing::internal::AssertHelper::~AssertHelper(&local_2b90);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(local_2b88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ad0);
  local_2c40 = sv("-9223372036854775808",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2c30,local_2c40,&local_2c68);
  oVar3 = ::wasm::WATParser::Lexer::takeU64(&local_2c30);
  local_2bd8._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_2bd0 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_2bc1 = std::optional::operator_cast_to_bool((optional *)&local_2bd8);
  local_2bc1 = !local_2bc1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2bc0,&local_2bc1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2c30);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2c68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2bc0);
  if (!bVar1) {
    testing::Message::Message(local_2c78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_31.message_,(internal *)local_2bc0,
               (AssertionResult *)"Lexer(\"-9223372036854775808\"sv).takeU64()","true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2c80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c80,local_2c78);
    testing::internal::AssertHelper::~AssertHelper(&local_2c80);
    std::__cxx11::string::~string((string *)&gtest_ar_31.message_);
    testing::Message::~Message(local_2c78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2bc0);
  local_2d28 = sv("-9223372036854775808",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2d18,local_2d28,&local_2d50);
  oVar3 = ::wasm::WATParser::Lexer::takeI64(&local_2d18);
  local_2cc0._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_2cb8 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_2d60[0] = 0x8000000000000000;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_unsigned_long,_nullptr>
            ((EqHelper *)local_2cb0,"Lexer(\"-9223372036854775808\"sv).takeI64()",
             "uint64_t((-9223372036854775807L-1))",(optional<unsigned_long> *)&local_2cc0,local_2d60
            );
  ::wasm::WATParser::Lexer::~Lexer(&local_2d18);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2d50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2cb0);
  if (!bVar1) {
    testing::Message::Message(&local_2d68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2cb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__23.message_,&local_2d68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_2d68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2cb0);
  local_2e00 = sv("-9223372036854775809",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2df0,local_2e00,&local_2e28);
  oVar3 = ::wasm::WATParser::Lexer::takeU64(&local_2df0);
  local_2d98._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_2d90 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_2d81 = std::optional::operator_cast_to_bool((optional *)&local_2d98);
  local_2d81 = !local_2d81;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d80,&local_2d81,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2df0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2e28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d80);
  if (!bVar1) {
    testing::Message::Message(local_2e38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_2d80,
               (AssertionResult *)"Lexer(\"-9223372036854775809\"sv).takeU64()","true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e40,local_2e38);
    testing::internal::AssertHelper::~AssertHelper(&local_2e40);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(local_2e38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d80);
  local_2ef0 = sv("-9223372036854775809",0x14);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2ee0,local_2ef0,&local_2f18);
  oVar3 = ::wasm::WATParser::Lexer::takeI64(&local_2ee0);
  local_2e88._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_2e80 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
  local_2e71 = std::optional::operator_cast_to_bool((optional *)&local_2e88);
  local_2e71 = !local_2e71;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e70,&local_2e71,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_2ee0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2f18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e70);
  if (!bVar1) {
    testing::Message::Message(local_2f28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f50,(internal *)local_2e70,
               (AssertionResult *)"Lexer(\"-9223372036854775809\"sv).takeI64()","true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0xb3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f30,local_2f28);
    testing::internal::AssertHelper::~AssertHelper(&local_2f30);
    std::__cxx11::string::~string((string *)&local_2f50);
    testing::Message::~Message(local_2f28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e70);
  return;
}

Assistant:

TEST(LexerTest, LexInt) {
  EXPECT_EQ(Lexer("0"sv).takeU8(), uint8_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI8(), uint8_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI16(), uint16_t(0));
  EXPECT_EQ(Lexer("0"sv).takeU32(), uint32_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI32(), uint32_t(0));
  EXPECT_EQ(Lexer("0"sv).takeU64(), uint64_t(0));
  EXPECT_EQ(Lexer("0"sv).takeI64(), uint64_t(0));

  EXPECT_FALSE(Lexer("+0"sv).takeU8());
  EXPECT_EQ(Lexer("+0"sv).takeI8(), uint8_t(0));

  EXPECT_FALSE(Lexer("-0"sv).takeU8());
  EXPECT_EQ(Lexer("-0"sv).takeI8(), uint8_t(0));

  EXPECT_EQ(Lexer("1"sv).takeU8(), uint8_t(1));
  EXPECT_EQ(Lexer("1"sv).takeI8(), uint8_t(1));

  EXPECT_FALSE(Lexer("+1"sv).takeU8());
  EXPECT_EQ(Lexer("+1"sv).takeI8(), uint8_t(1));

  EXPECT_FALSE(Lexer("-1"sv).takeU8());
  EXPECT_EQ(Lexer("-1").takeI8(), uint8_t(-1));

  EXPECT_EQ(Lexer("0010"sv).takeU8(), uint8_t(10));
  EXPECT_EQ(Lexer("0010"sv).takeI8(), uint8_t(10));

  EXPECT_FALSE(Lexer("+0010"sv).takeU8());
  EXPECT_EQ(Lexer("+0010"sv).takeI8(), uint8_t(10));

  EXPECT_FALSE(Lexer("-0010"sv).takeU8());
  EXPECT_EQ(Lexer("-0010"sv).takeI8(), uint8_t(-10));

  EXPECT_FALSE(Lexer("9999"sv).takeU8());
  EXPECT_EQ(Lexer("9999"sv).takeI16(), uint16_t(9999));
  EXPECT_EQ(Lexer("9999"sv).takeU32(), uint32_t(9999));
  EXPECT_EQ(Lexer("9999"sv).takeI32(), uint32_t(9999));

  EXPECT_FALSE(Lexer("+9999"sv).takeU32());
  EXPECT_EQ(Lexer("+9999"sv).takeI32(), uint32_t(9999));

  EXPECT_FALSE(Lexer("-9999"sv).takeU32());
  EXPECT_EQ(Lexer("-9999"sv).takeI32(), uint32_t(-9999));

  EXPECT_EQ(Lexer("12_34"sv).takeU32(), uint32_t(1234));
  EXPECT_EQ(Lexer("12_34"sv).takeI32(), uint32_t(1234));

  EXPECT_EQ(Lexer("1_2_3_4"sv).takeU32(), uint32_t(1234));
  EXPECT_EQ(Lexer("1_2_3_4"sv).takeI32(), uint32_t(1234));

  EXPECT_FALSE(Lexer("_1234"sv).takeU32());
  EXPECT_FALSE(Lexer("_1234"sv).takeI32());

  EXPECT_FALSE(Lexer("1234_"sv).takeU32());
  EXPECT_FALSE(Lexer("1234_"sv).takeI32());

  EXPECT_FALSE(Lexer("12__34"sv).takeU32());
  EXPECT_FALSE(Lexer("12__34"sv).takeI32());

  EXPECT_FALSE(Lexer("12cd56"sv).takeU32());
  EXPECT_FALSE(Lexer("12cd56"sv).takeI32());

  EXPECT_EQ(Lexer("18446744073709551615"sv).takeU64(), uint64_t(-1));
  EXPECT_EQ(Lexer("18446744073709551615"sv).takeI64(), uint64_t(-1));

  // 64-bit overflow!
  EXPECT_FALSE(Lexer("18446744073709551616"sv).takeU64());
  EXPECT_FALSE(Lexer("18446744073709551616"sv).takeI64());

  EXPECT_FALSE(Lexer("+9223372036854775807"sv).takeU64());
  EXPECT_EQ(Lexer("+9223372036854775807"sv).takeI64(), INT64_MAX);

  EXPECT_EQ(Lexer("9223372036854775808"sv).takeU64(), uint64_t(INT64_MAX) + 1);
  EXPECT_EQ(Lexer("9223372036854775808"sv).takeI64(), uint64_t(INT64_MAX) + 1);

  EXPECT_FALSE(Lexer("+9223372036854775808"sv).takeU64());
  EXPECT_FALSE(Lexer("+9223372036854775808"sv).takeI64());

  EXPECT_FALSE(Lexer("-9223372036854775808"sv).takeU64());
  EXPECT_EQ(Lexer("-9223372036854775808"sv).takeI64(), uint64_t(INT64_MIN));

  EXPECT_FALSE(Lexer("-9223372036854775809"sv).takeU64());
  EXPECT_FALSE(Lexer("-9223372036854775809"sv).takeI64());
}